

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeLinkClosure(cmGeneratorTarget *this,string *config,LinkClosure *lc)

{
  bool bVar1;
  cmLinkImplementation *pcVar2;
  char *pcVar3;
  pointer item;
  pointer pbVar4;
  const_iterator li;
  string propagates;
  const_iterator sit;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  languages;
  cmTargetCollectLinkLanguages cll;
  undefined1 local_158 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  const_iterator local_f0;
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  cmTargetCollectLinkLanguages local_98;
  
  cmsys::
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::hash_set((hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
              *)&local_e0);
  pcVar2 = GetLinkImplementation(this,config);
  if (pcVar2 != (cmLinkImplementation *)0x0) {
    for (pbVar4 = (pcVar2->Languages).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 != (pcVar2->Languages).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                *)&local_98,
               (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                *)&local_e0,pbVar4);
    }
    cmTargetCollectLinkLanguages::cmTargetCollectLinkLanguages
              (&local_98,this,config,
               (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                *)&local_e0,this);
    for (item = (pcVar2->super_cmLinkImplementationLibraries).Libraries.
                super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                super__Vector_impl_data._M_start;
        item != (pcVar2->super_cmLinkImplementationLibraries).Libraries.
                super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                super__Vector_impl_data._M_finish; item = item + 1) {
      cmTargetCollectLinkLanguages::Visit(&local_98,&item->super_cmLinkItem);
    }
    local_158._0_16_ =
         (undefined1  [16])
         cmsys::
         hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
         ::begin(&local_e0);
    while ((_Node *)local_158._0_8_ != (_Node *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&lc->Languages,&((_Node *)local_158._0_8_)->_M_val);
      cmsys::
      _Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::operator++((_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                    *)local_158);
    }
    std::__cxx11::string::string((string *)local_158,"HAS_CXX",(allocator *)&local_110);
    pcVar3 = GetProperty(this,(string *)local_158);
    std::__cxx11::string::~string((string *)local_158);
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::string((string *)local_158,"LINKER_LANGUAGE",(allocator *)&local_110);
      pcVar3 = GetProperty(this,(string *)local_158);
      std::__cxx11::string::~string((string *)local_158);
      if (pcVar3 == (char *)0x0) {
        local_140._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_140._M_impl.super__Rb_tree_header._M_header;
        local_158._0_8_ = local_158._4_8_ << 0x20;
        local_158._8_8_ = this;
        local_140._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_140._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_140._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_158._16_8_ = this->LocalGenerator->GlobalGenerator;
        local_140._M_impl.super__Rb_tree_header._M_header._M_right =
             local_140._M_impl.super__Rb_tree_header._M_header._M_left;
        for (pbVar4 = (pcVar2->Languages).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar4 != (pcVar2->Languages).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
          cmTargetSelectLinker::Consider
                    ((cmTargetSelectLinker *)local_158,(pbVar4->_M_dataplus)._M_p);
        }
        local_f0 = cmsys::
                   hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                   ::begin(&local_e0);
        while (local_f0._M_cur != (_Node *)0x0) {
          std::operator+(&local_b8,"CMAKE_",&(local_f0._M_cur)->_M_val);
          std::operator+(&local_110,&local_b8,"_LINKER_PREFERENCE_PROPAGATES");
          std::__cxx11::string::~string((string *)&local_b8);
          bVar1 = cmMakefile::IsOn(this->Makefile,&local_110);
          if (bVar1) {
            cmTargetSelectLinker::Consider
                      ((cmTargetSelectLinker *)local_158,
                       ((local_f0._M_cur)->_M_val)._M_dataplus._M_p);
          }
          std::__cxx11::string::~string((string *)&local_110);
          cmsys::
          _Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::operator++(&local_f0);
        }
        cmTargetSelectLinker::Choose_abi_cxx11_(&local_110,(cmTargetSelectLinker *)local_158);
        std::__cxx11::string::operator=((string *)lc,(string *)&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_140);
      }
      else {
        std::__cxx11::string::assign((char *)lc);
      }
    }
    else {
      std::__cxx11::string::assign((char *)lc);
    }
    cmTargetCollectLinkLanguages::~cmTargetCollectLinkLanguages(&local_98);
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::~hashtable(&local_e0);
    return;
  }
  __assert_fail("impl",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0x74a,
                "void cmGeneratorTarget::ComputeLinkClosure(const std::string &, LinkClosure &) const"
               );
}

Assistant:

void cmGeneratorTarget::ComputeLinkClosure(const std::string& config,
                                           LinkClosure& lc) const
{
  // Get languages built in this target.
  CM_UNORDERED_SET<std::string> languages;
  cmLinkImplementation const* impl = this->GetLinkImplementation(config);
  assert(impl);
  for (std::vector<std::string>::const_iterator li = impl->Languages.begin();
       li != impl->Languages.end(); ++li) {
    languages.insert(*li);
  }

  // Add interface languages from linked targets.
  cmTargetCollectLinkLanguages cll(this, config, languages, this);
  for (std::vector<cmLinkImplItem>::const_iterator li =
         impl->Libraries.begin();
       li != impl->Libraries.end(); ++li) {
    cll.Visit(*li);
  }

  // Store the transitive closure of languages.
  for (CM_UNORDERED_SET<std::string>::const_iterator li = languages.begin();
       li != languages.end(); ++li) {
    lc.Languages.push_back(*li);
  }

  // Choose the language whose linker should be used.
  if (this->GetProperty("HAS_CXX")) {
    lc.LinkerLanguage = "CXX";
  } else if (const char* linkerLang = this->GetProperty("LINKER_LANGUAGE")) {
    lc.LinkerLanguage = linkerLang;
  } else {
    // Find the language with the highest preference value.
    cmTargetSelectLinker tsl(this);

    // First select from the languages compiled directly in this target.
    for (std::vector<std::string>::const_iterator li = impl->Languages.begin();
         li != impl->Languages.end(); ++li) {
      tsl.Consider(li->c_str());
    }

    // Now consider languages that propagate from linked targets.
    for (CM_UNORDERED_SET<std::string>::const_iterator sit = languages.begin();
         sit != languages.end(); ++sit) {
      std::string propagates =
        "CMAKE_" + *sit + "_LINKER_PREFERENCE_PROPAGATES";
      if (this->Makefile->IsOn(propagates)) {
        tsl.Consider(sit->c_str());
      }
    }

    lc.LinkerLanguage = tsl.Choose();
  }
}